

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_cache.cpp
# Opt level: O3

char * libtorrent::job_name(job_action_t job)

{
  undefined8 *puVar1;
  
  if (0x15 < job) {
    return "unknown";
  }
  puVar1 = (undefined8 *)(job_action_name + (ulong)job * 8);
  if (clear_piece < job) {
    puVar1 = (undefined8 *)(piece_log_t::job_names + (ulong)(job - 0xf) * 8);
  }
  return (char *)*puVar1;
}

Assistant:

char const* job_name(job_action_t const job)
	{
		int const j = static_cast<int>(job);
		if (j < 0 || j >= piece_log_t::last_job)
			return "unknown";

		if (j < piece_log_t::flushing)
			return job_action_name[static_cast<std::size_t>(j)];
		return piece_log_t::job_names[static_cast<std::size_t>(j - piece_log_t::flushing)];
	}